

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,float v)

{
  PackedData local_58;
  Type local_30;
  float local_14;
  Value *pVStack_10;
  float v_local;
  Value *this_local;
  
  local_14 = v;
  pVStack_10 = this;
  Type::Type(&local_30,float32);
  Value(this,&local_30);
  Type::~Type(&local_30);
  getData(&local_58,this);
  PackedData::setAs<float>(&local_58,local_14);
  return;
}

Assistant:

Value::Value (float    v)  : Value (Type (PrimitiveType::float32))   { getData().setAs (v); }